

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O2

deSocketResult deSocket_send(deSocket *sock,void *buf,size_t bufSize,size_t *numSentPtr)

{
  deSocketResult channels;
  ssize_t sVar1;
  size_t sVar2;
  int numBytes;
  
  sVar1 = send(sock->handle,buf,bufSize,0);
  numBytes = (int)sVar1;
  channels = mapSendRecvResult(numBytes);
  if (numSentPtr != (size_t *)0x0) {
    sVar2 = 0;
    if (0 < numBytes) {
      sVar2 = (long)numBytes;
    }
    *numSentPtr = sVar2;
  }
  if ((channels & (DE_SOCKETRESULT_ERROR|DE_SOCKETRESULT_CONNECTION_CLOSED)) ==
      DE_SOCKETRESULT_CONNECTION_CLOSED) {
    deSocket_setChannelsClosed(sock,channels);
  }
  return channels;
}

Assistant:

deSocketResult deSocket_send (deSocket* sock, const void* buf, size_t bufSize, size_t* numSentPtr)
{
	int				numSent	= (int)send(sock->handle, (const char*)buf, (NativeSize)bufSize, 0);
	deSocketResult	result	= mapSendRecvResult(numSent);

	if (numSentPtr)
		*numSentPtr = (numSent > 0) ? ((size_t)numSent) : (0);

	/* Update state. */
	if (result == DE_SOCKETRESULT_CONNECTION_CLOSED)
		deSocket_setChannelsClosed(sock, DE_SOCKETCHANNEL_SEND);
	else if (result == DE_SOCKETRESULT_CONNECTION_TERMINATED)
		deSocket_setChannelsClosed(sock, DE_SOCKETCHANNEL_BOTH);

	return result;
}